

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O1

Node * __thiscall Parser::parseLocalVarDeclaration(Parser *this)

{
  int iVar1;
  pointer pTVar2;
  Token *pTVar3;
  bool bVar4;
  Node *pNVar5;
  CompilationContext *ctx_;
  Node *list;
  vector<Node_*,_std::allocator<Node_*>_> varKeys;
  vector<Node_*,_std::allocator<Node_*>_> varValues;
  Node *local_b0;
  vector<Node_*,_std::allocator<Node_*>_> local_a8;
  vector<Node_*,_std::allocator<Node_*>_> local_88;
  Token *local_68;
  vector<Node_*,_std::allocator<Node_*>_> local_60;
  vector<Node_*,_std::allocator<Node_*>_> local_48;
  
  local_68 = this->tok;
  local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Node **)0x0;
  local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (Node **)0x0;
  local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Node **)0x0;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Node **)0x0;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Node **)0x0;
  ctx_ = this->ctx;
  if (ctx_->isError != false) {
LAB_00110758:
    if (local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_start ==
        local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      CompilationContext::error
                (this->ctx,0x7c,"expected name of variable",this->tok->line,(uint)this->tok->column)
      ;
      pNVar5 = (Node *)0x0;
    }
    else if (this->ctx->isError == false) {
      std::vector<Node_*,_std::allocator<Node_*>_>::vector(&local_48,&local_a8);
      std::vector<Node_*,_std::allocator<Node_*>_>::vector(&local_60,&local_88);
      pNVar5 = createLocalVarDeclarationNode(this,local_68,&local_48,&local_60);
      if (local_60.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      pNVar5 = (Node *)0x0;
    }
    if (local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (Node **)0x0) {
      operator_delete(local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return pNVar5;
  }
  do {
    iVar1 = this->pos;
    pTVar2 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pTVar2[iVar1].type == TK_LBRACE) {
      this->tok = pTVar2 + iVar1;
      this->pos = iVar1 + 1;
      pNVar5 = (Node *)operator_new(0x30);
      pTVar3 = this->tok;
      CompilationContext::Poolable::Poolable((Poolable *)pNVar5,ctx_);
      pNVar5->tok = pTVar3;
      (pNVar5->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pNVar5->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pNVar5->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pNVar5->nodeType = PNT_UNKNOWN;
      pNVar5->nodeType = PNT_LIST_OF_KEYS_TABLE;
      local_b0 = pNVar5;
      parseListOfVars(this,pNVar5,PNT_VAR_DECLARATOR);
      if (local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  ((vector<Node*,std::allocator<Node*>> *)&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_b0);
      }
      else {
        *local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish = local_b0;
        local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      expect(this,TK_RBRACE);
    }
    else {
      iVar1 = this->pos;
      if (pTVar2[iVar1].type == TK_LSQUARE) {
        this->tok = pTVar2 + iVar1;
        this->pos = iVar1 + 1;
        pNVar5 = (Node *)operator_new(0x30);
        pTVar3 = this->tok;
        CompilationContext::Poolable::Poolable((Poolable *)pNVar5,ctx_);
        pNVar5->tok = pTVar3;
        (pNVar5->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pNVar5->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pNVar5->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pNVar5->nodeType = PNT_UNKNOWN;
        pNVar5->nodeType = PNT_LIST_OF_KEYS_ARRAY;
        local_b0 = pNVar5;
        parseListOfVars(this,pNVar5,PNT_VAR_DECLARATOR);
        if (local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                    ((vector<Node*,std::allocator<Node*>> *)&local_a8,
                     (iterator)
                     local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_b0);
        }
        else {
          *local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_b0;
          local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        expect(this,TK_RSQUARE);
      }
      else {
        bVar4 = expect(this,TK_IDENTIFIER);
        if (bVar4) {
          local_b0 = createIdentifierNode(this,this->tok);
          if (local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*>
                      ((vector<Node*,std::allocator<Node*>> *)&local_a8,
                       (iterator)
                       local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_b0);
          }
          else {
            *local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish = local_b0;
            local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
      }
    }
    if (this->ctx->isError != false) goto LAB_00110758;
    iVar1 = this->pos;
    pTVar2 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pTVar2[iVar1].type == TK_ASSIGN) {
      this->tok = pTVar2 + iVar1;
      this->pos = iVar1 + 1;
      local_b0 = parseTernaryOp(this);
      if (local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*>
                  ((vector<Node*,std::allocator<Node*>> *)&local_88,
                   (iterator)
                   local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_b0);
      }
      else {
        *local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish = local_b0;
        local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      bVar4 = isEndOfStatement(this);
      if (!bVar4) {
        expect(this,TK_COMMA);
      }
    }
    else {
      iVar1 = this->pos;
      if (pTVar2[iVar1].type == TK_COMMA) {
        this->tok = pTVar2 + iVar1;
        this->pos = iVar1 + 1;
      }
      else {
        bVar4 = isEndOfStatement(this);
        if (!bVar4) {
          local_b0 = (Node *)0x0;
          if (local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*>
                      ((vector<Node*,std::allocator<Node*>> *)&local_88,
                       (iterator)
                       local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_b0);
          }
          else {
            *local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish = (Node *)0x0;
            local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          goto LAB_00110758;
        }
      }
      local_b0 = (Node *)0x0;
      if (local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*>
                  ((vector<Node*,std::allocator<Node*>> *)&local_88,
                   (iterator)
                   local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_b0);
      }
      else {
        *local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish = (Node *)0x0;
        local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
    }
    if (((this->tok->type != TK_COMMA) && (bVar4 = isEndOfStatement(this), bVar4)) ||
       (ctx_ = this->ctx, ctx_->isError == true)) goto LAB_00110758;
  } while( true );
}

Assistant:

Node * parseLocalVarDeclaration()
  {
    Token * tk = tok; // = "local"
    std::vector<Node *> varKeys;
    std::vector<Node *> varValues;
    while (!ctx.isError)
    {
      if (accept(TK_LBRACE))
      {
        Node * list = new Node(ctx, *tok);
        list->nodeType = PNT_LIST_OF_KEYS_TABLE;
        parseListOfVars(list, PNT_VAR_DECLARATOR);
        varKeys.push_back(list);
        expect(TK_RBRACE);
      }
      else if (accept(TK_LSQUARE))
      {
        Node * list = new Node(ctx, *tok);
        list->nodeType = PNT_LIST_OF_KEYS_ARRAY;
        parseListOfVars(list, PNT_VAR_DECLARATOR);
        varKeys.push_back(list);
        expect(TK_RSQUARE);
      }
      else if (expect(TK_IDENTIFIER))
      {
        varKeys.push_back(createIdentifierNode(*tok));
      }

      if (ctx.isError)
        break;

      if (accept(TK_ASSIGN))
      {
        varValues.push_back(parseTernaryOp());
        if (!isEndOfStatement())
          expect(TK_COMMA);
      }
      else if (accept(TK_COMMA) || isEndOfStatement())
      {
        varValues.push_back(nullptr);
      }
      else
      {
        varValues.push_back(nullptr);
        break;
      }

      if (tok->type != TK_COMMA && isEndOfStatement())
        break;
    }

    if (varKeys.empty())
    {
      ctx.error(124, "expected name of variable", tok->line, tok->column);
      return nullptr;
    }
    return ctx.isError ? nullptr : createLocalVarDeclarationNode(*tk, varKeys, varValues);
  }